

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::jacobiSVD<float>
               (Matrix33<float> *A,Matrix33<float> *U,Vec3<float> *S,Matrix33<float> *V,float tol,
               bool forcePositiveDeterminant)

{
  Matrix33<float> *in_RDI;
  byte in_R8B;
  undefined1 unaff_retaddr;
  float unaff_retaddr_00;
  Matrix33<float> *in_stack_00000008;
  Vec3<float> *in_stack_00000010;
  Matrix33<float> *in_stack_00000018;
  Matrix33<float> *in_stack_00000020;
  Matrix33<float> local_4c;
  byte local_25;
  
  local_25 = in_R8B & 1;
  Matrix33<float>::Matrix33(&local_4c,in_RDI);
  anon_unknown_20::twoSidedJacobiSVD<float>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
             unaff_retaddr_00,(bool)unaff_retaddr);
  return;
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec3<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}